

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O3

float plutovg_canvas_text_extents
                (plutovg_canvas_t *canvas,void *text,int length,plutovg_text_encoding_t encoding,
                plutovg_rect_t *extents)

{
  float size;
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar3;
  ushort uVar4;
  plutovg_font_face_t *face;
  float fVar5;
  plutovg_codepoint_t codepoint;
  glyph_t *pgVar6;
  plutovg_rect_t *ppVar7;
  bool bVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fStack_5c;
  plutovg_rect_t pStack_58;
  plutovg_text_iterator_t pStack_48;
  
  face = canvas->state->font_face;
  if ((face != (plutovg_font_face_t *)0x0) && (size = canvas->state->font_size, 0.0 < size)) {
    plutovg_text_iterator_init(&pStack_48,text,length,encoding);
    if (pStack_48.index < pStack_48.length) {
      fVar9 = 0.0;
      ppVar7 = (plutovg_rect_t *)0x0;
      do {
        codepoint = plutovg_text_iterator_next(&pStack_48);
        if (extents == (plutovg_rect_t *)0x0) {
          uVar4 = *(ushort *)((face->info).data + (long)(face->info).head + 0x12);
          pgVar6 = plutovg_font_face_get_glyph(face,codepoint);
          fVar5 = (float)pgVar6->advance_width * (size / (float)(ushort)(uVar4 << 8 | uVar4 >> 8));
        }
        else {
          plutovg_font_face_get_glyph_metrics
                    (face,size,codepoint,&fStack_5c,(float *)0x0,&pStack_58);
          pStack_58.x = pStack_58.x + fVar9;
          fVar5 = fStack_5c;
          if (ppVar7 == (plutovg_rect_t *)0x0) {
            extents->x = pStack_58.x;
            extents->y = pStack_58.y;
            extents->w = pStack_58.w;
            extents->h = pStack_58.h;
            ppVar7 = extents;
          }
          else {
            uVar2._0_4_ = ppVar7->x;
            uVar2._4_4_ = ppVar7->y;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = uVar2;
            uVar1 = ppVar7->w;
            uVar3 = ppVar7->h;
            auVar12._0_4_ = (float)uVar1 + (float)(undefined4)uVar2;
            auVar12._4_4_ = (float)uVar3 + (float)uVar2._4_4_;
            auVar12._8_8_ = 0;
            auVar11._4_4_ = pStack_58.y;
            auVar11._0_4_ = pStack_58.x;
            auVar11._8_8_ = 0;
            auVar11 = minps(auVar10,auVar11);
            auVar13._4_4_ = pStack_58.h + pStack_58.y;
            auVar13._0_4_ = pStack_58.w + pStack_58.x;
            auVar13._8_8_ = 0;
            auVar13 = maxps(auVar12,auVar13);
            ppVar7->x = (float)(int)auVar11._0_8_;
            ppVar7->y = (float)(int)(auVar11._0_8_ >> 0x20);
            ppVar7->w = auVar13._0_4_ - auVar11._0_4_;
            ppVar7->h = auVar13._4_4_ - auVar11._4_4_;
          }
        }
        fVar9 = fVar9 + fVar5;
      } while (pStack_48.index < pStack_48.length);
      bVar8 = ppVar7 != (plutovg_rect_t *)0x0;
    }
    else {
      fVar9 = 0.0;
      bVar8 = false;
    }
    if (extents != (plutovg_rect_t *)0x0 && !bVar8) {
      extents->x = 0.0;
      extents->y = 0.0;
      extents->w = 0.0;
      extents->h = 0.0;
    }
    return fVar9;
  }
  if (extents != (plutovg_rect_t *)0x0) {
    extents->x = 0.0;
    extents->y = 0.0;
    extents->w = 0.0;
    extents->h = 0.0;
  }
  return 0.0;
}

Assistant:

float plutovg_canvas_text_extents(plutovg_canvas_t* canvas, const void* text, int length, plutovg_text_encoding_t encoding, plutovg_rect_t* extents)
{
    plutovg_state_t* state = canvas->state;
    if(state->font_face && state->font_size > 0.f) {
        return plutovg_font_face_text_extents(state->font_face, state->font_size, text, length, encoding, extents);
    }

    if(extents) {
        extents->x = 0.f;
        extents->y = 0.f;
        extents->w = 0.f;
        extents->h = 0.f;
    }

    return 0.f;
}